

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(QStringList *origAppArgs,int *exitCode)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QBenchmarkGlobalData *pQVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  qint64 pid;
  long lVar8;
  int i;
  ulong uVar9;
  QString *pQVar10;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QArrayDataPointer<QString> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QString local_a0;
  QString local_88;
  Data *local_70;
  char16_t *local_68;
  qsizetype local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = (origAppArgs->d).ptr;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_b8,L"--tool=callgrind",0x10);
  Qt::Literals::StringLiterals::operator____s(&local_a0,L"--instr-atstart=yes",0x13);
  Qt::Literals::StringLiterals::operator____s(&local_88,L"--quiet",7);
  local_70 = (pQVar10->d).d;
  local_68 = (pQVar10->d).ptr;
  local_60 = (pQVar10->d).size;
  if (local_70 != (Data *)0x0) {
    LOCK();
    (local_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (local_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  Qt::Literals::StringLiterals::operator____s(&local_58,L"-callgrindchild",0xf);
  args._M_len = 5;
  args._M_array = (iterator)&local_b8;
  QList<QString>::QList((QList<QString> *)&local_d8,args);
  lVar8 = 0x60;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&local_b8.d + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  lVar8 = 0x18;
  for (uVar9 = 1; uVar9 < (ulong)(origAppArgs->d).size; uVar9 = uVar9 + 1) {
    pQVar10 = (QString *)((long)&(((origAppArgs->d).ptr)->d).d + lVar8);
    local_b8.d = (Data *)0xa;
    local_b8.ptr = L"-callgrind";
    bVar5 = operator==(pQVar10,(QLatin1StringView *)&local_b8);
    if (!bVar5) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_d8,pQVar10);
    }
    lVar8 = lVar8 + 0x18;
  }
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_e8,(QObject *)0x0);
  Qt::Literals::StringLiterals::operator____s((QString *)&local_b8,L"valgrind",8);
  QProcess::start(&local_e8,&local_b8,&local_d8,3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QProcess::waitForStarted((int)&local_e8);
  pid = QProcess::processId();
  outFileBase((QString *)&local_b8,pid);
  pQVar4 = QBenchmarkGlobalData::current;
  pDVar2 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d;
  pcVar3 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d = local_b8.d;
  (pQVar4->callgrindOutFileBase).d.ptr = local_b8.ptr;
  qVar1 = (pQVar4->callgrindOutFileBase).d.size;
  (pQVar4->callgrindOutFileBase).d.size = local_b8.size;
  local_b8.d = pDVar2;
  local_b8.ptr = pcVar3;
  local_b8.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  uVar6 = QProcess::waitForFinished((int)&local_e8);
  iVar7 = QProcess::exitCode();
  *exitCode = iVar7;
  QProcess::readAllStandardOutput();
  dumpOutput((QByteArray *)&local_b8,_stdout);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
  QProcess::readAllStandardError();
  dumpOutput((QByteArray *)&local_b8,_stderr);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
  QProcess::~QProcess((QProcess *)&local_e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(const QStringList &origAppArgs, int &exitCode)
{
    const QString &execFile = origAppArgs.at(0);
    QStringList args{ u"--tool=callgrind"_s, u"--instr-atstart=yes"_s,
                      u"--quiet"_s, execFile, u"-callgrindchild"_s };

    // pass on original arguments that make sense (e.g. avoid wasting time producing output
    // that will be ignored anyway) ...
    for (int i = 1; i < origAppArgs.size(); ++i) {
        const QString &arg = origAppArgs.at(i);
        if (arg == "-callgrind"_L1)
            continue;
        args << arg; // ok to pass on
    }

    QProcess process;
    process.start(u"valgrind"_s, args);
    process.waitForStarted(-1);
    QBenchmarkGlobalData::current->callgrindOutFileBase =
        QBenchmarkValgrindUtils::outFileBase(process.processId());
    const bool finishedOk = process.waitForFinished(-1);
    exitCode = process.exitCode();

    dumpOutput(process.readAllStandardOutput(), stdout);
    dumpOutput(process.readAllStandardError(), stderr);

    return finishedOk;
}